

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O0

ChArchiveOut * __thiscall
chrono::ChArchiveOut::operator<<(ChArchiveOut *this,ChNameValue<std::pair<int,_double>_> *bVal)

{
  ChNameValue<std::pair<int,_double>_> local_30;
  ChNameValue<std::pair<int,_double>_> *local_18;
  ChNameValue<std::pair<int,_double>_> *bVal_local;
  ChArchiveOut *this_local;
  
  local_18 = bVal;
  bVal_local = (ChNameValue<std::pair<int,_double>_> *)this;
  ChNameValue<std::pair<int,_double>_>::ChNameValue(&local_30,bVal);
  out<int,double>(this,&local_30);
  ChNameValue<std::pair<int,_double>_>::~ChNameValue(&local_30);
  return this;
}

Assistant:

ChArchiveOut& operator<<(ChNameValue<T> bVal) {
          this->out(bVal);
          return (*this);
      }